

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O3

uint32_t MurmurHashAligned2(void *key,int len,uint32_t seed)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar7 = seed ^ len;
  uVar10 = (uint)key & 3;
  if (len < 4 || ((ulong)key & 3) == 0) {
    uVar10 = len;
    if (3 < len) {
      do {
        iVar2 = *key;
        key = (void *)((long)key + 4);
        uVar7 = uVar7 * 0x5bd1e995 ^
                ((uint)(iVar2 * 0x5bd1e995) >> 0x18 ^ iVar2 * 0x5bd1e995) * 0x5bd1e995;
        len = uVar10 - 4;
        bVar3 = 7 < uVar10;
        uVar10 = len;
      } while (bVar3);
    }
    if (len != 1) {
      if (len != 2) {
        if (len != 3) goto LAB_00164a71;
        uVar7 = uVar7 ^ (uint)*(byte *)((long)key + 2) << 0x10;
      }
      uVar7 = uVar7 ^ (uint)*(byte *)((long)key + 1) << 8;
    }
    bVar1 = *key;
  }
  else {
    uVar4 = 0;
    uVar9 = 0;
    if (uVar10 != 3) {
      if (uVar10 != 2) {
        uVar9 = (uint)*(byte *)((long)key + 2) << 0x10;
      }
      uVar4 = uVar9 | (uint)*(byte *)((long)key + 1) << 8;
    }
    iVar2 = uVar10 * 8;
    uVar9 = (*key | uVar4) << iVar2;
    uVar4 = 4 - uVar10;
    puVar5 = (uint *)((ulong)uVar4 + (long)key);
    uVar6 = uVar4 * 8;
    for (uVar4 = len - uVar4; 3 < uVar4; uVar4 = uVar4 - 4) {
      uVar11 = uVar9 >> iVar2;
      uVar9 = *puVar5;
      puVar5 = puVar5 + 1;
      uVar11 = (uVar9 << (uVar6 & 0x1f) | uVar11) * 0x5bd1e995;
      uVar7 = uVar7 * 0x5bd1e995 ^ (uVar11 >> 0x18 ^ uVar11) * 0x5bd1e995;
    }
    if (uVar4 < uVar10) {
      if (uVar4 != 0) {
        uVar10 = 0;
        if (uVar4 != 1) {
          uVar10 = (uint)*(byte *)((long)puVar5 + 1) << 8;
        }
        uVar4 = (byte)*puVar5 | uVar10;
      }
      uVar7 = ((uVar4 << (uVar6 & 0x1f) | uVar9 >> iVar2) ^ uVar7) * 0x5bd1e995;
      goto LAB_00164a71;
    }
    uVar11 = 0;
    if (uVar10 != 1) {
      if (uVar10 != 2) {
        uVar11 = (uint)*(byte *)((long)puVar5 + 2) << 0x10;
      }
      uVar11 = uVar11 | (uint)*(byte *)((long)puVar5 + 1) << 8;
    }
    uVar8 = (ulong)((uint)key & 3);
    uVar9 = (((byte)*puVar5 | uVar11) << (uVar6 & 0x1f) | uVar9 >> iVar2) * 0x5bd1e995;
    uVar7 = uVar7 * 0x5bd1e995 ^ (uVar9 >> 0x18 ^ uVar9) * 0x5bd1e995;
    if (uVar4 - uVar10 != 1) {
      if (uVar4 - uVar10 != 2) goto LAB_00164a71;
      uVar7 = uVar7 ^ (uint)*(byte *)((long)puVar5 + uVar8 + 1) << 8;
    }
    bVar1 = *(byte *)((long)puVar5 + uVar8);
  }
  uVar7 = (bVar1 ^ uVar7) * 0x5bd1e995;
LAB_00164a71:
  uVar7 = (uVar7 >> 0xd ^ uVar7) * 0x5bd1e995;
  return uVar7 >> 0xf ^ uVar7;
}

Assistant:

uint32_t MurmurHashAligned2 ( const void * key, int len, uint32_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;

  const unsigned char * data = (const unsigned char *)key;

  uint32_t h = seed ^ len;

  int align = (uint64_t)data & 3;

  if(align && (len >= 4))
  {
    // Pre-load the temp registers

    uint32_t t = 0, d = 0;

    switch(align)
    {
      case 1: t |= data[2] << 16;
      case 2: t |= data[1] << 8;
      case 3: t |= data[0];
    }

    t <<= (8 * align);

    data += 4-align;
    len -= 4-align;

    int sl = 8 * (4-align);
    int sr = 8 * align;

    // Mix

    while(len >= 4)
    {
      d = *(uint32_t *)data;
      t = (t >> sr) | (d << sl);

      uint32_t k = t;

      MIX(h,k,m);

      t = d;

      data += 4;
      len -= 4;
    }

    // Handle leftover data in temp registers

    d = 0;

    if(len >= align)
    {
      switch(align)
      {
      case 3: d |= data[2] << 16;
      case 2: d |= data[1] << 8;
      case 1: d |= data[0];
      }

      uint32_t k = (t >> sr) | (d << sl);
      MIX(h,k,m);

      data += align;
      len -= align;

      //----------
      // Handle tail bytes

      switch(len)
      {
      case 3: h ^= data[2] << 16;
      case 2: h ^= data[1] << 8;
      case 1: h ^= data[0];
          h *= m;
      };
    }
    else
    {
      switch(len)
      {
      case 3: d |= data[2] << 16;
      case 2: d |= data[1] << 8;
      case 1: d |= data[0];
      case 0: h ^= (t >> sr) | (d << sl);
          h *= m;
      }
    }

    h ^= h >> 13;
    h *= m;
    h ^= h >> 15;

    return h;
  }
  else
  {
    while(len >= 4)
    {
      uint32_t k = *(uint32_t *)data;

      MIX(h,k,m);

      data += 4;
      len -= 4;
    }

    //----------
    // Handle tail bytes

    switch(len)
    {
    case 3: h ^= data[2] << 16;
    case 2: h ^= data[1] << 8;
    case 1: h ^= data[0];
        h *= m;
    };

    h ^= h >> 13;
    h *= m;
    h ^= h >> 15;

    return h;
  }
}